

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Union::addNewDataLocation(Union *this,uint lgSize)

{
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> **ppRVar1;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *pRVar2;
  uint uVar3;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *pRVar4;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> RVar5;
  size_t newSize;
  
  uVar3 = (*this->parent->_vptr_StructOrGroup[1])();
  pRVar4 = (this->dataLocations).builder.pos;
  if (pRVar4 == (this->dataLocations).builder.endPtr) {
    pRVar2 = (this->dataLocations).builder.ptr;
    newSize = 4;
    if (pRVar4 != pRVar2) {
      newSize = (long)pRVar4 - (long)pRVar2 >> 2;
    }
    kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::setCapacity
              (&this->dataLocations,newSize);
    pRVar4 = (this->dataLocations).builder.pos;
  }
  RVar5.offset = uVar3;
  RVar5.lgSize = lgSize;
  *pRVar4 = RVar5;
  ppRVar1 = &(this->dataLocations).builder.pos;
  *ppRVar1 = *ppRVar1 + 1;
  return uVar3;
}

Assistant:

uint addNewDataLocation(uint lgSize) {
      // Add a whole new data location to the union with the given size.

      uint offset = parent.addData(lgSize);
      dataLocations.add(DataLocation { lgSize, offset });
      return offset;
    }